

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian-branching.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>::setup
          (MaskedHungarianBranching<lineage::heuristics::PartitionGraph> *this)

{
  _func_int **pp_Var1;
  bool bVar2;
  PartitionGraph *pPVar3;
  reference pvVar4;
  reference pvVar5;
  value_type vVar6;
  size_t sVar7;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_RDI;
  VertexIterator it_1;
  VertexIterator it;
  value_type currentDistance;
  long *frame;
  value_type v;
  anon_class_8_1_73d94478 withinMaxTimeStep;
  vector<unsigned_long,_std::allocator<unsigned_long>_> distance;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  long centerFrame;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  *in_stack_fffffffffffffe38;
  HungarianBranching<lineage::heuristics::PartitionGraph> *in_stack_fffffffffffffe40;
  allocator_type *in_stack_fffffffffffffe48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe80;
  long local_b8;
  long *local_b0;
  value_type local_a8;
  anon_class_8_1_73d94478 local_a0 [2];
  unsigned_long local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88 [5];
  long local_10;
  
  local_10 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                       (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_fffffffffffffe40);
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
  pPVar3 = HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::operator[](&pPVar3->partitions_,
               (size_type)
               in_RDI[1].partitions_.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  bVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)0x1d3a3a);
  if (!bVar2) {
    std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
              ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
  }
  HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1d3a98);
  local_90 = std::numeric_limits<unsigned_long>::max();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1d3ac2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe60,CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
             ,(value_type_conflict *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1d3af6);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (local_88,(size_type)
                               in_RDI[1].
                               super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.graph_)
  ;
  *pvVar4 = 0;
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (local_88,(size_type)
                               in_RDI[1].partitions_.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  *pvVar4 = 0;
  local_a0[0].centerFrame = local_10;
  while (bVar2 = std::
                 queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                 empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)0x1d3b56), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
             front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)0x1d3b76);
    local_a8 = *pvVar5;
    std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
              ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
               0x1d3b8e);
    local_b8 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                         (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
    local_b0 = &local_b8;
    if (local_b8 < local_10) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                (in_stack_fffffffffffffe50,(unsigned_long *)in_stack_fffffffffffffe48);
    }
    else if (local_b8 == local_10) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                (in_stack_fffffffffffffe50,(unsigned_long *)in_stack_fffffffffffffe48);
    }
    else {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long_const&>
                (in_stack_fffffffffffffe50,(unsigned_long *)in_stack_fffffffffffffe48);
    }
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_88,local_a8);
    pp_Var1 = (_func_int **)*pvVar4;
    if (pp_Var1 < in_RDI[1].super_BranchingOptimizer<lineage::heuristics::PartitionGraph>.
                  _vptr_BranchingOptimizer) {
      HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
      andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
      verticesFromVertexBegin
                ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                 (size_t)in_stack_fffffffffffffe50);
      while( true ) {
        HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
        andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
        verticesFromVertexEnd
                  ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                   CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   (size_t)in_stack_fffffffffffffe50);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        if (!bVar2) break;
        andres::graph::detail::IteratorHelper<true>::operator*((IteratorHelper<true> *)0x1d3d76);
        sVar7 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                          (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
        bVar2 = setup::anon_class_8_1_73d94478::operator()(local_a0,sVar7);
        if (bVar2) {
          vVar6 = andres::graph::detail::IteratorHelper<true>::operator*
                            ((IteratorHelper<true> *)0x1d3dca);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_88,vVar6);
          if ((long)pp_Var1 + 1U < *pvVar4) {
            vVar6 = andres::graph::detail::IteratorHelper<true>::operator*
                              ((IteratorHelper<true> *)0x1d3e14);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_88,vVar6);
            *pvVar4 = (long)pp_Var1 + 1;
            in_stack_fffffffffffffe80 =
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 andres::graph::detail::IteratorHelper<true>::operator*
                           ((IteratorHelper<true> *)0x1d3e42);
            std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
          }
        }
        andres::graph::detail::IteratorHelper<true>::operator++
                  ((IteratorHelper<true> *)in_stack_fffffffffffffe40);
      }
      HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
      andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::verticesToVertexBegin
                ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                 (size_t)in_stack_fffffffffffffe50);
      while( true ) {
        HungarianBranching<lineage::heuristics::PartitionGraph>::getGraph(in_RDI);
        andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::verticesToVertexEnd
                  ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                   CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                   (size_t)in_stack_fffffffffffffe50);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        if (!bVar2) break;
        andres::graph::detail::IteratorHelper<true>::operator*((IteratorHelper<true> *)0x1d3f10);
        sVar7 = HungarianBranching<lineage::heuristics::PartitionGraph>::getFrame
                          (in_stack_fffffffffffffe40,(size_t)in_stack_fffffffffffffe38);
        in_stack_fffffffffffffe5f = setup::anon_class_8_1_73d94478::operator()(local_a0,sVar7);
        if ((bool)in_stack_fffffffffffffe5f) {
          in_stack_fffffffffffffe50 =
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               andres::graph::detail::IteratorHelper<true>::operator*
                         ((IteratorHelper<true> *)0x1d3f64);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (local_88,(size_type)in_stack_fffffffffffffe50);
          if ((long)pp_Var1 + 1U < *pvVar4) {
            in_stack_fffffffffffffe40 =
                 (HungarianBranching<lineage::heuristics::PartitionGraph> *)((long)pp_Var1 + 1);
            in_stack_fffffffffffffe48 =
                 (allocator_type *)
                 andres::graph::detail::IteratorHelper<true>::operator*
                           ((IteratorHelper<true> *)0x1d3fae);
            pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               (local_88,(size_type)in_stack_fffffffffffffe48);
            *pvVar4 = (value_type)in_stack_fffffffffffffe40;
            in_stack_fffffffffffffe38 =
                 (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                  *)andres::graph::detail::IteratorHelper<true>::operator*
                              ((IteratorHelper<true> *)0x1d3fdc);
            std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
            push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *
                 )in_stack_fffffffffffffe40,(value_type *)in_stack_fffffffffffffe38);
          }
        }
        andres::graph::detail::IteratorHelper<true>::operator++
                  ((IteratorHelper<true> *)in_stack_fffffffffffffe40);
      }
    }
  }
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (in_stack_fffffffffffffe80);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (in_stack_fffffffffffffe80);
  remove_duplicates<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (in_stack_fffffffffffffe80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe50);
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x1d4076);
  return;
}

Assistant:

inline void
MaskedHungarianBranching<GRAPH>::setup()
{
    const auto centerFrame = this->getFrame(A_);

    std::queue<size_t> queue;
    queue.push(A_);

    if (!this->getGraph().partitions_[B_].empty())
        queue.push(B_);

    std::vector<size_t> distance(this->getGraph().numberOfVertices(),
                                 std::numeric_limits<size_t>::max());
    distance[A_] = 0;
    distance[B_] = 0;

    auto withinMaxTimeStep = [=](size_t other) {
        if (other == centerFrame)
            return true;
        if (other < centerFrame && (centerFrame - other) == 1) {
            return true;
        } else if (other > centerFrame && (other - centerFrame) == 1) {
            return true;
        } else {
            return false;
        }
    };

    while (!queue.empty()) {

        const auto v = queue.front();
        queue.pop();

        // put the node in the correct set of nodes.
        auto const& frame = this->getFrame(v);
        if (frame < centerFrame)
            first_.emplace_back(v);
        else if (frame == centerFrame)
            second_.emplace_back(v);
        else
            third_.emplace_back(v);

        auto const currentDistance = distance[v];
        if (currentDistance >= maxDistance_) {
            continue;
        }

        // outgoing edges ...
        for (auto it = this->getGraph().verticesFromVertexBegin(v);
             it != this->getGraph().verticesFromVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }

        // ... and incoming edges.
        for (auto it = this->getGraph().verticesToVertexBegin(v);
             it != this->getGraph().verticesToVertexEnd(v); ++it) {

            if (!withinMaxTimeStep(this->getFrame(*it))) {
                continue;
            }

            if (distance[*it] > currentDistance + 1) {
                distance[*it] = currentDistance + 1;
                queue.push(*it);
            }
        }
    }

    // just be sure that there are no duplicates.
    remove_duplicates(first_);
    remove_duplicates(second_);
    remove_duplicates(third_);
}